

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_a40::GetTemporalParametersForTimeBase
               (double *f0,int f0_length,int fs,int y_length,double frame_period,double lowest_f0,
               double *time_axis,double *coarse_time_axis,double *coarse_f0,double *coarse_vuv)

{
  double local_50;
  int local_48;
  int local_44;
  int i_1;
  int i;
  double *coarse_time_axis_local;
  double *time_axis_local;
  double lowest_f0_local;
  double frame_period_local;
  int y_length_local;
  int fs_local;
  int f0_length_local;
  double *f0_local;
  
  for (local_44 = 0; local_44 < y_length; local_44 = local_44 + 1) {
    time_axis[local_44] = (double)local_44 / (double)fs;
  }
  for (local_48 = 0; local_48 < f0_length; local_48 = local_48 + 1) {
    coarse_time_axis[local_48] = (double)local_48 * frame_period;
    if (lowest_f0 <= f0[local_48]) {
      local_50 = f0[local_48];
    }
    else {
      local_50 = 0.0;
    }
    coarse_f0[local_48] = local_50;
    coarse_vuv[local_48] = (double)(~-(ulong)(coarse_f0[local_48] == 0.0) & 0x3ff0000000000000);
  }
  coarse_time_axis[f0_length] = (double)f0_length * frame_period;
  coarse_f0[f0_length] =
       coarse_f0[f0_length + -1] + coarse_f0[f0_length + -1] + -coarse_f0[f0_length + -2];
  coarse_vuv[f0_length] =
       coarse_vuv[f0_length + -1] + coarse_vuv[f0_length + -1] + -coarse_vuv[f0_length + -2];
  return;
}

Assistant:

static void GetTemporalParametersForTimeBase(const double *f0, int f0_length,
    int fs, int y_length, double frame_period, double lowest_f0,
    double *time_axis, double *coarse_time_axis, double *coarse_f0,
    double *coarse_vuv) {
  for (int i = 0; i < y_length; ++i)
    time_axis[i] = i / static_cast<double>(fs);
  // the array 'coarse_time_axis' is supposed to have 'f0_length + 1' positions
  for (int i = 0; i < f0_length; ++i) {
    coarse_time_axis[i] = i * frame_period;
    coarse_f0[i] = f0[i] < lowest_f0 ? 0.0 : f0[i];
    coarse_vuv[i] = coarse_f0[i] == 0.0 ? 0.0 : 1.0;
  }
  coarse_time_axis[f0_length] = f0_length * frame_period;
  coarse_f0[f0_length] = coarse_f0[f0_length - 1] * 2 -
    coarse_f0[f0_length - 2];
  coarse_vuv[f0_length] = coarse_vuv[f0_length - 1] * 2 -
    coarse_vuv[f0_length - 2];
}